

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O0

void __thiscall
QDirListing::QDirListing
          (QDirListing *this,QString *path,QStringList *nameFilters,IteratorFlags flags)

{
  _Head_base<0UL,_QAbstractFileEngine_*,_false> _Var1;
  undefined4 in_ECX;
  QDirListingPrivate *in_RDI;
  long in_FS_OFFSET;
  QFileSystemEntry *in_stack_ffffffffffffff68;
  QFileSystemEntry *this_00;
  QDirListingPrivate *this_01;
  QFileSystemEntry local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  _Var1._M_head_impl = (QAbstractFileEngine *)operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate(this_01);
  (in_RDI->engine)._M_t.
  super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
  super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
  super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl = _Var1._M_head_impl;
  this_00 = &local_40;
  QFileSystemEntry::QFileSystemEntry(this_00,&in_stack_ffffffffffffff68->m_filePath);
  QFileSystemEntry::operator=(this_00,in_stack_ffffffffffffff68);
  QFileSystemEntry::~QFileSystemEntry(this_00);
  QList<QString>::operator=((QList<QString> *)this_00,(QList<QString> *)in_stack_ffffffffffffff68);
  *(undefined4 *)
   &(in_RDI->engine)._M_t.
    super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
    super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
    super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl[10]._vptr_QAbstractFileEngine =
       in_ECX;
  QDirListingPrivate::init
            ((QDirListingPrivate *)
             (in_RDI->engine)._M_t.
             super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>.
             _M_t.
             super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
             .super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, const QStringList &nameFilters, IteratorFlags flags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->nameFilters = nameFilters;
    d->iteratorFlags = flags;
    d->init();
}